

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

void testing::internal::TuplePrefixPrinter<1ul>::
     TersePrintPrefixToStrings<std::tuple<double_const*,double_const*>>
               (tuple<const_double_*,_const_double_*> *t,Strings *strings)

{
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1b8;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  PrintTo<double_const*>
            (&(t->super__Tuple_impl<0UL,_const_double_*,_const_double_*>).
              super__Head_base<0UL,_const_double_*,_false>._M_head_impl,local_188);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)strings,
             &bStack_1b8);
  std::__cxx11::string::~string((string *)&bStack_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

static void TersePrintPrefixToStrings(const Tuple& t, Strings* strings) {
    ::std::stringstream ss;
    UniversalTersePrint(::std::tr1::get<0>(t), &ss);
    strings->push_back(ss.str());
  }